

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetFilenameComponentCommand.cxx
# Opt level: O0

bool __thiscall
cmGetFilenameComponentCommand::InitialPass
          (cmGetFilenameComponentCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  long lVar6;
  char *pcVar7;
  const_reference __lhs;
  ulong uVar8;
  undefined1 local_220 [8];
  string err;
  string local_1e0;
  uint local_1c0;
  allocator local_1b9;
  uint i_1;
  string baseDir;
  string local_178;
  uint local_154;
  undefined1 local_150 [4];
  uint i;
  string local_130;
  undefined1 local_110 [8];
  string programArgs;
  string storeArgs;
  string other;
  KeyWOW64 other_view;
  KeyWOW64 view;
  string filename;
  string result;
  char *cacheValue;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmGetFilenameComponentCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_007a85a5;
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
  pcVar2 = param_2_local;
  if (3 < sVar4) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)pcVar2,sVar4 - 1);
    bVar3 = std::operator==(pvVar5,"CACHE");
    if (bVar3) {
      pcVar1 = (this->super_cmCommand).Makefile;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      pcVar7 = cmMakefile::GetDefinition(pcVar1,pvVar5);
      if ((pcVar7 != (char *)0x0) && (bVar3 = cmSystemTools::IsNOTFOUND(pcVar7), !bVar3)) {
        this_local._7_1_ = 1;
        goto LAB_007a85a5;
      }
    }
  }
  std::__cxx11::string::string((string *)(filename.field_2._M_local_buf + 8));
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,1);
  std::__cxx11::string::string((string *)&other_view,(string *)pvVar5);
  lVar6 = std::__cxx11::string::find((char *)&other_view,0xbb8673);
  if (lVar6 != -1) {
    other.field_2._12_4_ = 1;
    other.field_2._8_4_ = 2;
    bVar3 = cmMakefile::PlatformIs64Bit((this->super_cmCommand).Makefile);
    if (bVar3) {
      other.field_2._12_4_ = 2;
      other.field_2._8_4_ = 1;
    }
    cmSystemTools::ExpandRegistryValues((string *)&other_view,other.field_2._12_4_);
    lVar6 = std::__cxx11::string::find((char *)&other_view,0xbaebf0);
    if (lVar6 != -1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,1);
      std::__cxx11::string::string((string *)(storeArgs.field_2._M_local_buf + 8),(string *)pvVar5);
      cmSystemTools::ExpandRegistryValues
                ((string *)((long)&storeArgs.field_2 + 8),other.field_2._8_4_);
      lVar6 = std::__cxx11::string::find(storeArgs.field_2._M_local_buf + 8,0xbaebf0);
      if (lVar6 == -1) {
        std::__cxx11::string::operator=
                  ((string *)&other_view,(string *)(storeArgs.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)(storeArgs.field_2._M_local_buf + 8));
    }
  }
  std::__cxx11::string::string((string *)(programArgs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_110);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,2);
  bVar3 = std::operator==(pvVar5,"DIRECTORY");
  if (bVar3) {
LAB_007a7d56:
    cmsys::SystemTools::GetFilenamePath(&local_130,(string *)&other_view);
    std::__cxx11::string::operator=
              ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
LAB_007a82f9:
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    pcVar2 = param_2_local;
    if (sVar4 < 4) {
LAB_007a8498:
      uVar8 = std::__cxx11::string::empty();
      if (((uVar8 & 1) == 0) && (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)((long)&programArgs.field_2 + 8),pcVar7);
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,pvVar5,pcVar7);
    }
    else {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)pcVar2,sVar4 - 1);
      bVar3 = std::operator==(pvVar5,"CACHE");
      if (!bVar3) goto LAB_007a8498;
      uVar8 = std::__cxx11::string::empty();
      if (((uVar8 & 1) == 0) && (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar7 = (char *)std::__cxx11::string::c_str();
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,2);
        bVar3 = std::operator==(pvVar5,"PATH");
        cmMakefile::AddCacheDefinition
                  (pcVar1,(string *)((long)&programArgs.field_2 + 8),pcVar7,"",bVar3 ^ STRING,false)
        ;
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local,2);
      bVar3 = std::operator==(__lhs,"PATH");
      cmMakefile::AddCacheDefinition(pcVar1,pvVar5,pcVar7,"",bVar3 ^ STRING,false);
    }
    this_local._7_1_ = 1;
  }
  else {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar3 = std::operator==(pvVar5,"PATH");
    if (bVar3) goto LAB_007a7d56;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar3 = std::operator==(pvVar5,"NAME");
    if (bVar3) {
      cmsys::SystemTools::GetFilenameName((string *)local_150,(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      goto LAB_007a82f9;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar3 = std::operator==(pvVar5,"PROGRAM");
    if (bVar3) {
      for (local_154 = 2; uVar8 = (ulong)local_154,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local), uVar8 < sVar4; local_154 = local_154 + 1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)local_154);
        bVar3 = std::operator==(pvVar5,"PROGRAM_ARGS");
        if (bVar3) {
          local_154 = local_154 + 1;
          uVar8 = (ulong)local_154;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local);
          if (uVar8 < sVar4) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_154);
            std::__cxx11::string::operator=
                      ((string *)(programArgs.field_2._M_local_buf + 8),(string *)pvVar5);
          }
        }
      }
      cmsys::SystemTools::SplitProgramFromArgs
                ((string *)&other_view,(string *)((long)&filename.field_2 + 8),(string *)local_110);
      goto LAB_007a82f9;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar3 = std::operator==(pvVar5,"EXT");
    if (bVar3) {
      cmsys::SystemTools::GetFilenameExtension(&local_178,(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      goto LAB_007a82f9;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar3 = std::operator==(pvVar5,"NAME_WE");
    if (bVar3) {
      cmsys::SystemTools::GetFilenameWithoutExtension
                ((string *)((long)&baseDir.field_2 + 8),(string *)&other_view);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),
                 (string *)(baseDir.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(baseDir.field_2._M_local_buf + 8));
      goto LAB_007a82f9;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar3 = std::operator==(pvVar5,"ABSOLUTE");
    if (bVar3) {
LAB_007a8060:
      pcVar7 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i_1,pcVar7,&local_1b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      for (local_1c0 = 3; uVar8 = (ulong)local_1c0,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local), uVar8 < sVar4; local_1c0 = local_1c0 + 1) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)local_1c0);
        bVar3 = std::operator==(pvVar5,"BASE_DIR");
        if (bVar3) {
          local_1c0 = local_1c0 + 1;
          uVar8 = (ulong)local_1c0;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local);
          if (uVar8 < sVar4) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)local_1c0);
            std::__cxx11::string::operator=((string *)&i_1,(string *)pvVar5);
          }
        }
      }
      cmsys::SystemTools::CollapseFullPath(&local_1e0,(string *)&other_view,(string *)&i_1);
      std::__cxx11::string::operator=
                ((string *)(filename.field_2._M_local_buf + 8),(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,2);
      bVar3 = std::operator==(pvVar5,"REALPATH");
      if (bVar3) {
        cmsys::SystemTools::GetRealPath
                  ((string *)((long)&err.field_2 + 8),(string *)((long)&filename.field_2 + 8),
                   (string *)0x0);
        std::__cxx11::string::operator=
                  ((string *)(filename.field_2._M_local_buf + 8),
                   (string *)(err.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)&i_1);
      goto LAB_007a82f9;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar3 = std::operator==(pvVar5,"REALPATH");
    if (bVar3) goto LAB_007a8060;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                   "unknown component ",pvVar5);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_220);
    this_local._7_1_ = 0;
    std::__cxx11::string::~string((string *)local_220);
  }
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)(programArgs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&other_view);
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
LAB_007a85a5:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetFilenameComponentCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // Check and see if the value has been stored in the cache
  // already, if so use that value
  if (args.size() >= 4 && args[args.size() - 1] == "CACHE") {
    const char* cacheValue = this->Makefile->GetDefinition(args[0]);
    if (cacheValue && !cmSystemTools::IsNOTFOUND(cacheValue)) {
      return true;
    }
  }

  std::string result;
  std::string filename = args[1];
  if (filename.find("[HKEY") != std::string::npos) {
    // Check the registry as the target application would view it.
    cmSystemTools::KeyWOW64 view = cmSystemTools::KeyWOW64_32;
    cmSystemTools::KeyWOW64 other_view = cmSystemTools::KeyWOW64_64;
    if (this->Makefile->PlatformIs64Bit()) {
      view = cmSystemTools::KeyWOW64_64;
      other_view = cmSystemTools::KeyWOW64_32;
    }
    cmSystemTools::ExpandRegistryValues(filename, view);
    if (filename.find("/registry") != std::string::npos) {
      std::string other = args[1];
      cmSystemTools::ExpandRegistryValues(other, other_view);
      if (other.find("/registry") == std::string::npos) {
        filename = other;
      }
    }
  }
  std::string storeArgs;
  std::string programArgs;
  if (args[2] == "DIRECTORY" || args[2] == "PATH") {
    result = cmSystemTools::GetFilenamePath(filename);
  } else if (args[2] == "NAME") {
    result = cmSystemTools::GetFilenameName(filename);
  } else if (args[2] == "PROGRAM") {
    for (unsigned int i = 2; i < args.size(); ++i) {
      if (args[i] == "PROGRAM_ARGS") {
        i++;
        if (i < args.size()) {
          storeArgs = args[i];
        }
      }
    }
    cmSystemTools::SplitProgramFromArgs(filename, result, programArgs);
  } else if (args[2] == "EXT") {
    result = cmSystemTools::GetFilenameExtension(filename);
  } else if (args[2] == "NAME_WE") {
    result = cmSystemTools::GetFilenameWithoutExtension(filename);
  } else if (args[2] == "ABSOLUTE" || args[2] == "REALPATH") {
    // If the path given is relative, evaluate it relative to the
    // current source directory unless the user passes a different
    // base directory.
    std::string baseDir = this->Makefile->GetCurrentSourceDirectory();
    for (unsigned int i = 3; i < args.size(); ++i) {
      if (args[i] == "BASE_DIR") {
        ++i;
        if (i < args.size()) {
          baseDir = args[i];
        }
      }
    }
    // Collapse the path to its simplest form.
    result = cmSystemTools::CollapseFullPath(filename, baseDir);
    if (args[2] == "REALPATH") {
      // Resolve symlinks if possible
      result = cmSystemTools::GetRealPath(result);
    }
  } else {
    std::string err = "unknown component " + args[2];
    this->SetError(err);
    return false;
  }

  if (args.size() >= 4 && args[args.size() - 1] == "CACHE") {
    if (!programArgs.empty() && !storeArgs.empty()) {
      this->Makefile->AddCacheDefinition(
        storeArgs, programArgs.c_str(), "",
        args[2] == "PATH" ? cmStateEnums::FILEPATH : cmStateEnums::STRING);
    }
    this->Makefile->AddCacheDefinition(
      args[0], result.c_str(), "",
      args[2] == "PATH" ? cmStateEnums::FILEPATH : cmStateEnums::STRING);
  } else {
    if (!programArgs.empty() && !storeArgs.empty()) {
      this->Makefile->AddDefinition(storeArgs, programArgs.c_str());
    }
    this->Makefile->AddDefinition(args[0], result.c_str());
  }

  return true;
}